

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O0

int accum_state_fullvar(vector_t ****var,vector_t ***mean,float32 ***dnom,vector_t **feat,
                       uint32 n_feat,uint32 *veclen,uint32 *sseq,uint32 *ci_sseq,uint32 n_frame)

{
  float32 *x;
  float32 **a;
  vector_t *cov;
  vector_t dvec;
  uint local_48;
  uint32 c;
  uint32 f;
  uint32 ci_s;
  uint32 s;
  uint32 t;
  uint32 *veclen_local;
  uint32 n_feat_local;
  vector_t **feat_local;
  float32 ***dnom_local;
  vector_t ***mean_local;
  vector_t ****var_local;
  
  for (ci_s = 0; ci_s < n_frame; ci_s = ci_s + 1) {
    if ((sseq == (uint32 *)0x0) || (ci_sseq == (uint32 *)0x0)) {
      f = 0;
      c = 0;
    }
    else {
      f = sseq[ci_s];
      c = ci_sseq[ci_s];
    }
    for (local_48 = 0; local_48 < n_feat; local_48 = local_48 + 1) {
      x = (float32 *)
          __ckd_calloc__((ulong)veclen[local_48],4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/accum.c"
                         ,0xb6);
      a = (float32 **)
          __ckd_calloc_2d__((ulong)veclen[local_48],(ulong)veclen[local_48],4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/accum.c"
                            ,0xb7);
      *dnom[f][local_48] = (float32)((float)*dnom[f][local_48] + 1.0);
      if (f != c) {
        *dnom[c][local_48] = (float32)((float)*dnom[c][local_48] + 1.0);
      }
      for (dvec._4_4_ = 0; dvec._4_4_ < veclen[local_48]; dvec._4_4_ = dvec._4_4_ + 1) {
        x[dvec._4_4_] =
             (float32)(feat[ci_s][local_48][dvec._4_4_] - (*mean[f][local_48])[dvec._4_4_]);
      }
      outerproduct(a,x,x,veclen[local_48]);
      matrixadd((float32 **)*var[f][local_48],a,veclen[local_48]);
      if (f != c) {
        for (dvec._4_4_ = 0; dvec._4_4_ < veclen[local_48]; dvec._4_4_ = dvec._4_4_ + 1) {
          x[dvec._4_4_] =
               (float32)(feat[ci_s][local_48][dvec._4_4_] - (*mean[c][local_48])[dvec._4_4_]);
        }
        outerproduct(a,x,x,veclen[local_48]);
        matrixadd((float32 **)*var[c][local_48],a,veclen[local_48]);
      }
      ckd_free(x);
      ckd_free_2d(a);
    }
  }
  return 0;
}

Assistant:

int
accum_state_fullvar(vector_t ****var,
		    vector_t ***mean,
		    float32  ***dnom,
		    vector_t **feat,
		    uint32 n_feat,
		    const uint32 *veclen,
		    uint32 *sseq,
		    uint32 *ci_sseq,
		    uint32 n_frame)
{
    uint32 t;		/* time (in frames) */
    uint32 s;		/* a tied state */
    uint32 ci_s;	/* a CI tied state */
    uint32 f;		/* a feature stream idx */
    uint32 c;		/* a vector component idx */

    for (t = 0; t < n_frame; t++) {

	if (sseq && ci_sseq) {
	    /* get the tied state for time t */
	    s = sseq[t];
	
	    /* get the CI state as well */
	    ci_s = ci_sseq[t];
	}
	else {
	    s = 0;
	    ci_s = 0;
	}

	for (f = 0; f < n_feat; f++) {
	    vector_t dvec = ckd_calloc(veclen[f], sizeof(float32));
	    vector_t *cov = (vector_t *)ckd_calloc_2d(veclen[f], veclen[f], sizeof(float32));

	    dnom[s][f][0] += 1.0;
	    if (s != ci_s) {
		dnom[ci_s][f][0] += 1.0;
	    }
	    for (c = 0; c < veclen[f]; c++)
		dvec[c] = feat[t][f][c] - mean[s][f][0][c];

	    outerproduct(cov, dvec, dvec, veclen[f]);
	    matrixadd(var[s][f][0], cov, veclen[f]);

	    if (s != ci_s) {
		for (c = 0; c < veclen[f]; c++)
		    dvec[c] = feat[t][f][c] - mean[ci_s][f][0][c];
		outerproduct(cov, dvec, dvec, veclen[f]);
		matrixadd(var[ci_s][f][0], cov, veclen[f]);
	    }
	    ckd_free(dvec);
	    ckd_free_2d((void **)cov);
	}
    }
    return 0;
}